

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTVisitor.h
# Opt level: O2

ModuleBase * __thiscall
soul::RewritingASTVisitor::visitObject(RewritingASTVisitor *this,ModuleBase *t)

{
  ObjectType OVar1;
  int iVar2;
  _func_int *UNRECOVERED_JUMPTABLE;
  undefined4 extraout_var;
  allocator<char> local_29;
  string local_28;
  
  OVar1 = (t->super_ASTObject).objectType;
  if (OVar1 == Namespace) {
    UNRECOVERED_JUMPTABLE = this->_vptr_RewritingASTVisitor[5];
  }
  else if (OVar1 == Processor) {
    UNRECOVERED_JUMPTABLE = this->_vptr_RewritingASTVisitor[3];
  }
  else {
    if (OVar1 != Graph) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_28,"Unknown AST module",&local_29);
      throwInternalCompilerError(&local_28);
    }
    UNRECOVERED_JUMPTABLE = this->_vptr_RewritingASTVisitor[4];
  }
  iVar2 = (*UNRECOVERED_JUMPTABLE)();
  return (ModuleBase *)CONCAT44(extraout_var,iVar2);
}

Assistant:

AST::ModuleBase& visitObject (AST::ModuleBase& t)
    {
        switch (t.objectType)
        {
            SOUL_AST_MODULES (SOUL_INVOKE_FOR_SUBCLASS)
            default: throwInternalCompilerError ("Unknown AST module"); return t;
        }
    }